

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O2

FactoredDecPOMDPDiscreteInterface *
ArgumentUtils::GetFactoredDecPOMDPDiscreteInterfaceFromArgs(Arguments *args)

{
  FactoredDecPOMDPDiscrete *this;
  ProblemFireFightingFactored *this_00;
  ostream *poVar1;
  ProblemAloha *this_01;
  E *this_02;
  Problem_t t;
  Arguments *in_RDX;
  FactoredDecPOMDPDiscreteInterface *pFVar2;
  allocator<char> local_221;
  MADPParser parser;
  string local_200;
  string local_1e0;
  string local_1c0;
  string dpomdpFile;
  
  switch(args->problem_type) {
  case DT:
  case FF:
    std::__cxx11::stringstream::stringstream((stringstream *)&dpomdpFile);
    ProblemType::SoftPrint_abi_cxx11_((string *)&parser,(ProblemType *)(ulong)args->problem_type,t);
    poVar1 = std::operator<<((ostream *)dpomdpFile.field_2._M_local_buf,(string *)&parser);
    poVar1 = std::operator<<(poVar1," is not factored.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&parser);
    this_02 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_02,(stringstream *)&dpomdpFile);
    __cxa_throw(this_02,&E::typeinfo,E::~E);
  case FFF:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingFactored::ProblemFireFightingFactored
              (this_00,args->nrAgents,args->nrHouses,args->nrFLs,0.0,false,1.0,true);
    break;
  case FFG:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingGraph::ProblemFireFightingGraph
              ((ProblemFireFightingGraph *)this_00,args->nrAgents,args->nrFLs,1.0,true);
    break;
  default:
    directories::MADPGetProblemFilename_abi_cxx11_(&dpomdpFile,(directories *)args,in_RDX);
    this = (FactoredDecPOMDPDiscrete *)operator_new(0x718);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"",(allocator<char> *)&parser);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_221);
    std::__cxx11::string::string((string *)&local_200,(string *)&dpomdpFile);
    FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete(this,&local_1c0,&local_1e0,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    MADPParser::Parse(&parser,this);
    if (args->marginalize == true) {
      FactoredDecPOMDPDiscrete::MarginalizeStateFactor
                (this,(Index)args->marginalizationIndex,args->sparse != 0);
    }
    else if (args->cache_flat_models == true) {
      (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                             super_MultiAgentDecisionProcess + 0x300))(this,args->sparse != 0);
    }
    pFVar2 = (FactoredDecPOMDPDiscreteInterface *)
             (&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
               super_MultiAgentDecisionProcess.field_0x0 +
             *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                 super_MultiAgentDecisionProcess + -0x58));
    std::__cxx11::string::~string((string *)&dpomdpFile);
    goto LAB_00405b8e;
  case Aloha:
    this_01 = (ProblemAloha *)operator_new(0x748);
    ProblemAloha::ProblemAloha
              (this_01,args->islandConf,args->alohaVariation,args->maxBacklog,args->nrAgents,true);
    pFVar2 = (FactoredDecPOMDPDiscreteInterface *)
             (&(this_01->super_FactoredDecPOMDPDiscrete).
               super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess
               .field_0x0 +
             *(long *)(*(long *)&(this_01->super_FactoredDecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                 super_MultiAgentDecisionProcess + -0x58));
    if (args->cache_flat_models == true) {
      (**(code **)(*(long *)((long)&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xf8)) + 0x210)
      )((long)&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xf8),args->sparse != 0);
    }
    goto LAB_00405b8e;
  }
  pFVar2 = (FactoredDecPOMDPDiscreteInterface *)
           (&(this_00->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
             field_0x0 +
           *(long *)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                               super_MultiAgentDecisionProcessDiscreteFactoredStates.
                               super_MultiAgentDecisionProcess + -0x58));
  if (args->cache_flat_models == true) {
    (**(code **)(*(long *)((long)&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xf8)) + 0x210))
              ((long)&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xf8),args->sparse != 0);
  }
  if (0 < args->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"ArgumentUtils: Problem instantiated.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
LAB_00405b8e:
  if (0.0 < args->discount) {
    (**(code **)(*(long *)((long)&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xb0)) + 0x68))
              ((long)&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xb0));
  }
  return pFVar2;
}

Assistant:

FactoredDecPOMDPDiscreteInterface* GetFactoredDecPOMDPDiscreteInterfaceFromArgs(const Arguments& args)
{
    FactoredDecPOMDPDiscreteInterface * dp = 0;
    switch(args.problem_type) 
    {

        case(ProblemType::DT):
        case(ProblemType::FF):
        {
            stringstream ss;
            ss << SoftPrint(args.problem_type) << " is not factored."<< endl;
            throw(E(ss));
            break;
        }
        case(ProblemType::FFF):
        {
            dp = new ProblemFireFightingFactored(args.nrAgents, args.nrHouses, args.nrFLs);
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem instantiated." << endl;
            break;
        }
        case(ProblemType::FFG):
        {
            dp = new ProblemFireFightingGraph(args.nrAgents, args.nrFLs);
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem instantiated." << endl;
            break;
        }
        case(ProblemType::Aloha):
        {
            dp = new ProblemAloha(
                static_cast<ProblemAloha::IslandConfiguration>(args.islandConf),
                static_cast<ProblemAloha::AlohaVariation>(args.alohaVariation),
                args.maxBacklog,
                args.nrAgents );
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            break;
        }
        case(ProblemType::PARSE):
        default: 
        {   
            string dpomdpFile=directories::MADPGetProblemFilename(args);
            FactoredDecPOMDPDiscrete* decpomdp = 
                new FactoredDecPOMDPDiscrete("", "", dpomdpFile);
            
            MADPParser parser(decpomdp);

            if(args.marginalize)
                decpomdp->MarginalizeStateFactor(args.marginalizationIndex,args.sparse);
            else if(args.cache_flat_models)
                decpomdp->CacheFlatModels(args.sparse);
                
            dp = decpomdp;
            break;
        }
        
    }
    if(args.discount > 0)
        dp->SetDiscount(args.discount);

    return dp;
}